

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int ParseEXRHeaderFromMemory
              (EXRAttribute *customAttributes,int *numCustomAttributes,int *width,int *height,
              uchar *memory)

{
  pointer *ty;
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  byte *pbVar5;
  int *piVar6;
  uint *puVar7;
  float *pfVar8;
  reference pvVar9;
  char *pcVar10;
  void *__dest;
  size_type sVar11;
  reference pvVar12;
  EXRAttribute *pEVar13;
  int local_15c;
  int i;
  int dataHeight;
  int dataWidth;
  EXRAttribute attrib;
  char *marker_next;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string attrType;
  string attrName;
  vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> attribs;
  vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
  channels;
  int local_88;
  float pixelAspectRatio;
  int numChannels;
  float screenWindowWidth;
  float screenWindowCenter [2];
  int displayWindow [4];
  uint local_60;
  uint local_5c;
  int lineOrder;
  int dh;
  int dw;
  int dy;
  int dx;
  char header [4];
  char *marker;
  char *buf;
  uchar *memory_local;
  int *height_local;
  int *width_local;
  int *numCustomAttributes_local;
  EXRAttribute *customAttributes_local;
  
  if (memory == (uchar *)0x0) {
    customAttributes_local._4_4_ = -1;
  }
  else {
    dy = 0x1312f76;
    if (*(int *)memory == 0x1312f76) {
      if ((((memory[4] == '\x02') && (memory[5] == '\0')) && (memory[6] == '\0')) &&
         (memory[7] == '\0')) {
        _dx = memory + 8;
        dw = -1;
        dh = -1;
        lineOrder = -1;
        local_5c = 0xffffffff;
        local_60 = 0;
        screenWindowCenter[0] = -NAN;
        screenWindowCenter[1] = -NAN;
        displayWindow[0] = -1;
        displayWindow[1] = -1;
        memset(&numChannels,0,8);
        pixelAspectRatio = 1.0;
        local_88 = -1;
        channels.
        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x3f800000;
        std::
        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ::vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                  *)&attribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::vector
                  ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                   ((long)&attrName.field_2 + 8));
        if (numCustomAttributes != (int *)0x0) {
          *numCustomAttributes = 0;
        }
        do {
          std::__cxx11::string::string((string *)(attrType.field_2._M_local_buf + 8));
          ty = &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
          std::__cxx11::string::string((string *)ty);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next);
          puVar4 = (uchar *)anon_unknown.dwarf_13fc48::ReadAttribute
                                      ((string *)(attrType.field_2._M_local_buf + 8),(string *)ty,
                                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                       &marker_next,(char *)_dx);
          if (puVar4 == (uchar *)0x0) {
            attrib.value._0_4_ = 2;
            _dx = _dx + 1;
          }
          else {
            iVar3 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
            if (iVar3 == 0) {
              pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  &marker_next,0);
              if (4 < *pbVar5) {
                customAttributes_local._4_4_ = -5;
                attrib.value._0_4_ = 1;
                goto LAB_00260496;
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
              if (iVar3 == 0) {
                anon_unknown.dwarf_13fc48::ReadChannelInfo
                          ((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                            *)&attribs.
                               super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next);
                sVar11 = std::
                         vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                         ::size((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                 *)&attribs.
                                    super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
                local_88 = (int)sVar11;
                if (local_88 < 1) {
                  customAttributes_local._4_4_ = -6;
                  attrib.value._0_4_ = 1;
                  goto LAB_00260496;
                }
              }
              else {
                iVar3 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                if (iVar3 == 0) {
                  piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&marker_next,0);
                  dw = *piVar6;
                  piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&marker_next,4);
                  dh = *piVar6;
                  piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                            ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              *)&marker_next,8);
                  lineOrder = *piVar6;
                  puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                             ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                               *)&marker_next,0xc);
                  local_5c = *puVar7;
                  bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
                  if (bVar2) {
                    anon_unknown.dwarf_13fc48::swap4((uint *)&dw);
                    anon_unknown.dwarf_13fc48::swap4((uint *)&dh);
                    anon_unknown.dwarf_13fc48::swap4((uint *)&lineOrder);
                    anon_unknown.dwarf_13fc48::swap4(&local_5c);
                  }
                }
                else {
                  iVar3 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                  if (iVar3 == 0) {
                    pfVar8 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&marker_next,0);
                    screenWindowCenter[0] = *pfVar8;
                    pfVar8 = (float *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                                ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&marker_next,4);
                    screenWindowCenter[1] = *pfVar8;
                    piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next,8);
                    displayWindow[0] = *piVar6;
                    piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                              ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next,0xc);
                    displayWindow[1] = *piVar6;
                    bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
                    if (bVar2) {
                      anon_unknown.dwarf_13fc48::swap4((uint *)screenWindowCenter);
                      anon_unknown.dwarf_13fc48::swap4((uint *)(screenWindowCenter + 1));
                      anon_unknown.dwarf_13fc48::swap4((uint *)displayWindow);
                      anon_unknown.dwarf_13fc48::swap4((uint *)(displayWindow + 1));
                    }
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                    if (iVar3 == 0) {
                      puVar7 = (uint *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                       at((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next,0);
                      local_60 = *puVar7;
                      bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
                      if (bVar2) {
                        anon_unknown.dwarf_13fc48::swap4(&local_60);
                      }
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                      if (iVar3 == 0) {
                        pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *
                                            )&marker_next,0);
                        channels.
                        super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                             *(undefined4 *)pvVar9;
                        bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
                        if (bVar2) {
                          anon_unknown.dwarf_13fc48::swap4
                                    ((uint *)((long)&channels.
                                                  super__Vector_base<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                             + 4));
                        }
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                        if (iVar3 == 0) {
                          piVar6 = (int *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>
                                          ::at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next,0);
                          numChannels = *piVar6;
                          pfVar8 = (float *)std::
                                            vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                            at((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                *)&marker_next,4);
                          screenWindowWidth = *pfVar8;
                          bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
                          if (bVar2) {
                            anon_unknown.dwarf_13fc48::swap4((uint *)&numChannels);
                            anon_unknown.dwarf_13fc48::swap4((uint *)&screenWindowWidth);
                          }
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare(attrType.field_2._M_local_buf + 8);
                          if (iVar3 == 0) {
                            pfVar8 = (float *)std::
                                              vector<unsigned_char,_std::allocator<unsigned_char>_>
                                              ::at((
                                                  vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                  *)&marker_next,0);
                            pixelAspectRatio = *pfVar8;
                            bVar2 = anon_unknown.dwarf_13fc48::IsBigEndian();
                            if (bVar2) {
                              anon_unknown.dwarf_13fc48::swap4((uint *)&pixelAspectRatio);
                            }
                          }
                          else if ((numCustomAttributes != (int *)0x0) &&
                                  (*numCustomAttributes < 0x80)) {
                            printf("custom\n");
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            _dataHeight = strdup(pcVar10);
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            attrib.name = strdup(pcVar10);
                            sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                     size((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next);
                            attrib.type._0_4_ = (undefined4)sVar11;
                            sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                     size((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next);
                            __dest = malloc(sVar11);
                            attrib._16_8_ = __dest;
                            pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                                               ((vector<unsigned_char,_std::allocator<unsigned_char>_>
                                                 *)&marker_next,0);
                            sVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                     size((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          &marker_next);
                            memcpy(__dest,pvVar9,sVar11);
                            std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::push_back
                                      ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                       ((long)&attrName.field_2 + 8),(value_type *)&dataHeight);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            attrib.value._0_4_ = 0;
            _dx = puVar4;
          }
LAB_00260496:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&marker_next);
          std::__cxx11::string::~string
                    ((string *)
                     &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
          std::__cxx11::string::~string((string *)(attrType.field_2._M_local_buf + 8));
        } while ((int)attrib.value == 0);
        if ((int)attrib.value == 2) {
          if (dw < 0) {
            __assert_fail("dx >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x22d0,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          if (dh < 0) {
            __assert_fail("dy >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x22d1,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          if (lineOrder < 0) {
            __assert_fail("dw >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x22d2,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          if ((int)local_5c < 0) {
            __assert_fail("dh >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x22d3,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          if (local_88 < 1) {
            __assert_fail("numChannels >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                          ,0x22d4,
                          "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                         );
          }
          *width = (lineOrder - dw) + 1;
          *height = (local_5c - dh) + 1;
          if (numCustomAttributes != (int *)0x0) {
            sVar11 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size
                               ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                ((long)&attrName.field_2 + 8));
            if (0x7f < sVar11) {
              __assert_fail("attribs.size() < TINYEXR_MAX_ATTRIBUTES",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                            ,0x22dd,
                            "int ParseEXRHeaderFromMemory(EXRAttribute *, int *, int *, int *, const unsigned char *)"
                           );
            }
            sVar11 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size
                               ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                ((long)&attrName.field_2 + 8));
            *numCustomAttributes = (int)sVar11;
            for (local_15c = 0;
                sVar11 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::size
                                   ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                    ((long)&attrName.field_2 + 8)), local_15c < (int)sVar11;
                local_15c = local_15c + 1) {
              pvVar12 = std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::operator[]
                                  ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                                   ((long)&attrName.field_2 + 8),(long)local_15c);
              pEVar13 = customAttributes + local_15c;
              pEVar13->name = pvVar12->name;
              pEVar13->type = pvVar12->type;
              uVar1 = *(undefined4 *)&pvVar12->field_0x14;
              pEVar13->size = pvVar12->size;
              *(undefined4 *)&pEVar13->field_0x14 = uVar1;
              pEVar13->value = pvVar12->value;
            }
          }
          customAttributes_local._4_4_ = 0;
          attrib.value._0_4_ = 1;
        }
        std::vector<_EXRAttribute,_std::allocator<_EXRAttribute>_>::~vector
                  ((vector<_EXRAttribute,_std::allocator<_EXRAttribute>_> *)
                   ((long)&attrName.field_2 + 8));
        std::
        vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
        ::~vector((vector<(anonymous_namespace)::ChannelInfo,_std::allocator<(anonymous_namespace)::ChannelInfo>_>
                   *)&attribs.super__Vector_base<_EXRAttribute,_std::allocator<_EXRAttribute>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      else {
        customAttributes_local._4_4_ = -4;
      }
    }
    else {
      customAttributes_local._4_4_ = -3;
    }
  }
  return customAttributes_local._4_4_;
}

Assistant:

int ParseEXRHeaderFromMemory(EXRAttribute* customAttributes, int *numCustomAttributes, int *width, int *height,
                             const unsigned char *memory) {

  if (memory == NULL) {
    // Invalid argument
    return -1;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[0];

  // Header check.
  {
    const char header[] = {0x76, 0x2f, 0x31, 0x01};

    if (memcmp(marker, header, 4) != 0) {
      // if (err) {
      //  (*err) = "Header mismatch.";
      //}
      return -3;
    }
    marker += 4;
  }

  // Version, scanline.
  {
    // must be [2, 0, 0, 0]
    if (marker[0] != 2 || marker[1] != 0 || marker[2] != 0 || marker[3] != 0) {
      // if (err) {
      //  (*err) = "Unsupported version or scanline.";
      //}
      return -4;
    }

    marker += 4;
  }

  int dx = -1;
  int dy = -1;
  int dw = -1;
  int dh = -1;
  int lineOrder = 0; // @fixme
  int displayWindow[4] = {-1, -1, -1, -1}; // @fixme
  float screenWindowCenter[2] = {0.0f, 0.0f}; // @fixme
  float screenWindowWidth = 1.0f; // @fixme
  int numChannels = -1;
  float pixelAspectRatio = 1.0f; // @fixme
  std::vector<ChannelInfo> channels;
  std::vector<EXRAttribute> attribs;

  if (numCustomAttributes) {
    (*numCustomAttributes) = 0;
  }

  // Read attributes
  for (;;) {
    std::string attrName;
    std::string attrType;
    std::vector<unsigned char> data;
    const char *marker_next = ReadAttribute(attrName, attrType, data, marker);
    if (marker_next == NULL) {
      marker++; // skip '\0'
      break;
    }

    if (attrName.compare("compression") == 0) {
      // must be 0:No compression, 1: RLE or 3: ZIP
      //      if (data[0] != 0 && data[0] != 1 && data[0] != 3) {

      //	mwkm
      //	0 : NO_COMPRESSION
      //	1 : RLE
      //	2 : ZIPS (Single scanline)
      //	3 : ZIP (16-line block)
      //	4 : PIZ (32-line block)
      if (data[0] > 4) {
        // if (err) {
        //  (*err) = "Unsupported compression type.";
        //}
        return -5;
      }

    } else if (attrName.compare("channels") == 0) {

      // name: zero-terminated string, from 1 to 255 bytes long
      // pixel type: int, possible values are: UINT = 0 HALF = 1 FLOAT = 2
      // pLinear: unsigned char, possible values are 0 and 1
      // reserved: three chars, should be zero
      // xSampling: int
      // ySampling: int

      ReadChannelInfo(channels, data);

      numChannels = channels.size();

      if (numChannels < 1) {
        // if (err) {
        //  (*err) = "Invalid channels format.";
        //}
        return -6;
      }

    } else if (attrName.compare("dataWindow") == 0) {
      memcpy(&dx, &data.at(0), sizeof(int));
      memcpy(&dy, &data.at(4), sizeof(int));
      memcpy(&dw, &data.at(8), sizeof(int));
      memcpy(&dh, &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&dx));
        swap4(reinterpret_cast<unsigned int *>(&dy));
        swap4(reinterpret_cast<unsigned int *>(&dw));
        swap4(reinterpret_cast<unsigned int *>(&dh));
      }
    } else if (attrName.compare("displayWindow") == 0) {
      memcpy(&displayWindow[0], &data.at(0), sizeof(int));
      memcpy(&displayWindow[1], &data.at(4), sizeof(int));
      memcpy(&displayWindow[2], &data.at(8), sizeof(int));
      memcpy(&displayWindow[3], &data.at(12), sizeof(int));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[0]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[1]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[2]));
        swap4(reinterpret_cast<unsigned int *>(&displayWindow[3]));
      }
    } else if (attrName.compare("lineOrder") == 0) {
      memcpy(&lineOrder, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&lineOrder));
      }
    } else if (attrName.compare("pixelAspectRatio") == 0) {
      memcpy(&pixelAspectRatio, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&pixelAspectRatio));
      }
    } else if (attrName.compare("screenWindowCenter") == 0) {
      memcpy(&screenWindowCenter[0], &data.at(0), sizeof(float));
      memcpy(&screenWindowCenter[1], &data.at(4), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[0]));
        swap4(reinterpret_cast<unsigned int *>(&screenWindowCenter[1]));
      }
    } else if (attrName.compare("screenWindowWidth") == 0) {
      memcpy(&screenWindowWidth, &data.at(0), sizeof(float));
      if (IsBigEndian()) {
        swap4(reinterpret_cast<unsigned int *>(&screenWindowWidth));
      }
      
    } else {
      // Custom attribute(up to TINYEXR_MAX_ATTRIBUTES)
      if (numCustomAttributes && ((*numCustomAttributes) < TINYEXR_MAX_ATTRIBUTES)) {
        printf("custom\n");
        EXRAttribute attrib;
        attrib.name = strdup(attrName.c_str());
        attrib.type = strdup(attrType.c_str());
        attrib.size = data.size();
        attrib.value = (unsigned char*)malloc(data.size());
        memcpy((char*)attrib.value, &data.at(0), data.size());
        attribs.push_back(attrib);
      }
    }

    marker = marker_next;
  }

  assert(dx >= 0);
  assert(dy >= 0);
  assert(dw >= 0);
  assert(dh >= 0);
  assert(numChannels >= 1);

  int dataWidth = dw - dx + 1;
  int dataHeight = dh - dy + 1;

  (*width) = dataWidth;
  (*height) = dataHeight;

  if (numCustomAttributes) {
    assert(attribs.size() < TINYEXR_MAX_ATTRIBUTES);
    (*numCustomAttributes) = attribs.size();

    // Assume the pointer to customAttributes has enough memory to store.
    for (int i = 0; i < (int)attribs.size(); i++) {
      customAttributes[i] = attribs[i];
    }
  } 

  return 0;
}